

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

bool ImPlot::BeginDragDropSourceY
               (ImPlotYAxis axis,ImGuiKeyModFlags key_mods,ImGuiDragDropFlags flags)

{
  ImRect *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiID id;
  ImGuiIO *pIVar4;
  ImRect rect;
  ImRect local_38;
  
  pIVar4 = ImGui::GetIO();
  if (pIVar4->KeyMods == key_mods) {
    GImPlot->CurrentPlot->YAxis[axis].Dragging = false;
  }
  id = ImGuiWindow::GetID(GImGui->CurrentWindow,axis + 0x990f41);
  pIVar1 = &GImPlot->CurrentPlot->YAxis[axis].HoverRect;
  local_38.Min = pIVar1->Min;
  local_38.Max = pIVar1->Max;
  bVar3 = false;
  bVar2 = ImGui::ItemAdd(&local_38,id,&local_38,0);
  if (bVar2) {
    bVar3 = BeginDragDropSourceEx(id,GImPlot->CurrentPlot->YAxis[axis].ExtHovered,flags,key_mods);
  }
  return bVar3;
}

Assistant:

bool BeginDragDropSourceY(ImPlotYAxis axis, ImGuiKeyModFlags key_mods, ImGuiDragDropFlags flags) {
    if (ImGui::GetIO().KeyMods == key_mods)
        GImPlot->CurrentPlot->YAxis[axis].Dragging = false;
    const ImGuiID ID = GImGui->CurrentWindow->GetID(IMPLOT_ID_YAX + axis);
    ImRect rect = GImPlot->CurrentPlot->YAxis[axis].HoverRect;
    return  ImGui::ItemAdd(rect, ID, &rect) && BeginDragDropSourceEx(ID, GImPlot->CurrentPlot->YAxis[axis].ExtHovered, flags, key_mods);
}